

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

void __thiscall CHeap::growheap(CHeap *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  heapelement *phVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar6 = 20000000;
  if (this->allocated < 0x989681) {
    iVar6 = this->allocated * 2;
  }
  uVar11 = (ulong)iVar6;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  this->allocated = iVar6;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
    uVar10 = SUB168(auVar4 * ZEXT816(0x18),0) | 8;
  }
  puVar7 = (ulong *)operator_new__(uVar10);
  *puVar7 = uVar11;
  if (iVar6 != 0) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)puVar7 + lVar8 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar8 = lVar8 + 0x18;
    } while (uVar11 * 0x18 - lVar8 != 0);
  }
  iVar6 = this->currentsize;
  phVar3 = this->heap;
  lVar8 = 8;
  for (lVar9 = 0; lVar9 <= iVar6; lVar9 = lVar9 + 1) {
    *(undefined8 *)((long)puVar7 + lVar8) = *(undefined8 *)((long)(&phVar3->key + -1) + lVar8);
    puVar1 = (undefined8 *)((long)(phVar3->key).key + lVar8 + -8);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)(((heapelement *)(puVar7 + 1))->key).key + lVar8 + -8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar8 = lVar8 + 0x18;
  }
  if (phVar3 != (heapelement *)0x0) {
    operator_delete__(phVar3[-1].key.key + 1,phVar3[-1].key.key[1] * 0x18 + 8);
  }
  this->heap = (heapelement *)(puVar7 + 1);
  return;
}

Assistant:

void CHeap::growheap()
{
    heapelement* newheap;
    int i;

    SBPL_PRINTF("growing heap size from %d ", allocated);

    allocated = 2 * allocated;
    if (allocated > HEAPSIZE) allocated = HEAPSIZE;

    SBPL_PRINTF("to %d\n", allocated);

    newheap = new heapelement[allocated];

    for (i = 0; i <= currentsize; ++i)
        newheap[i] = heap[i];

    delete[] heap;

    heap = newheap;
}